

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::cmState(cmState *this)

{
  _Rb_tree_header *p_Var1;
  cmCacheManager *this_00;
  cmGlobVerificationManager *pcVar2;
  
  p_Var1 = &(this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->EnabledLanguages).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->BuiltinCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ScriptedCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->GlobalProperties).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalProperties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalProperties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GlobalProperties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->GlobalProperties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->GlobalProperties).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(&this->BuildsystemDirectory,0,0xf0);
  (this->SourceDirectory)._M_dataplus._M_p = (pointer)&(this->SourceDirectory).field_2;
  (this->SourceDirectory)._M_string_length = 0;
  (this->SourceDirectory).field_2._M_local_buf[0] = '\0';
  (this->BinaryDirectory)._M_dataplus._M_p = (pointer)&(this->BinaryDirectory).field_2;
  (this->BinaryDirectory)._M_string_length = 0;
  (this->BinaryDirectory).field_2._M_local_buf[0] = '\0';
  this->CurrentMode = Unknown;
  this->IsInTryCompile = false;
  this->IsGeneratorMultiConfig = false;
  this->WindowsShell = false;
  this->WindowsVSIDE = false;
  this->GhsMultiIDE = false;
  this->WatcomWMake = false;
  this->MinGWMake = false;
  this->NMake = false;
  this->MSYSShell = false;
  this_00 = (cmCacheManager *)operator_new(0x38);
  cmCacheManager::cmCacheManager(this_00);
  this->CacheManager = this_00;
  pcVar2 = (cmGlobVerificationManager *)operator_new(0x70);
  p_Var1 = &(pcVar2->Cache)._M_t._M_impl.super__Rb_tree_header;
  (pcVar2->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pcVar2->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pcVar2->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pcVar2->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pcVar2->Cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pcVar2->VerifyScript)._M_dataplus._M_p = (pointer)&(pcVar2->VerifyScript).field_2;
  (pcVar2->VerifyScript)._M_string_length = 0;
  (pcVar2->VerifyScript).field_2._M_local_buf[0] = '\0';
  (pcVar2->VerifyStamp)._M_dataplus._M_p = (pointer)&(pcVar2->VerifyStamp).field_2;
  (pcVar2->VerifyStamp)._M_string_length = 0;
  (pcVar2->VerifyStamp).field_2._M_local_buf[0] = '\0';
  this->GlobVerificationManager = pcVar2;
  return;
}

Assistant:

cmState::cmState()
{
  this->CacheManager = new cmCacheManager;
  this->GlobVerificationManager = new cmGlobVerificationManager;
}